

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

size_t mfwrite(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  char *pcVar1;
  size_t local_48;
  void *new_data;
  size_t new_alloced;
  mFILE *mf_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if ((mf->mode & 2U) == 0) {
    ptr_local = (void *)0x0;
  }
  else {
    if ((mf->mode & 4U) != 0) {
      mf->offset = mf->size;
    }
    while (mf->alloced < size * nmemb + mf->offset) {
      if (mf->alloced == 0) {
        local_48 = 0x400;
      }
      else {
        local_48 = mf->alloced << 1;
      }
      pcVar1 = (char *)realloc(mf->data,local_48);
      if (pcVar1 == (char *)0x0) {
        return 0;
      }
      mf->alloced = local_48;
      mf->data = pcVar1;
    }
    if (mf->offset < mf->flush_pos) {
      mf->flush_pos = mf->offset;
    }
    memcpy(mf->data + mf->offset,ptr,size * nmemb);
    mf->offset = size * nmemb + mf->offset;
    ptr_local = (void *)nmemb;
    if (mf->size < mf->offset) {
      mf->size = mf->offset;
    }
  }
  return (size_t)ptr_local;
}

Assistant:

size_t mfwrite(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    if (!(mf->mode & MF_WRITE))
	return 0;

    /* Append mode => forced all writes to end of file */
    if (mf->mode & MF_APPEND)
	mf->offset = mf->size;

    /* Make sure we have enough room */
    while (size * nmemb + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data = realloc(mf->data, new_alloced);
	if (NULL == new_data) return 0;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    /* Record where we need to reflush from */
    if (mf->offset < mf->flush_pos)
	mf->flush_pos = mf->offset;

    /* Copy the data over */
    memcpy(&mf->data[mf->offset], ptr, size * nmemb);
    mf->offset += size * nmemb;
    if (mf->size < mf->offset)
	mf->size = mf->offset;

    return nmemb;
}